

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  local_int_t localLength;
  int iVar1;
  int iVar2;
  int iVar3;
  Geometry *geom;
  ostream *poVar4;
  ulong uVar5;
  double *pdVar6;
  Vector *xexact_00;
  int iVar7;
  ulong uVar8;
  SparseMatrix *pSVar9;
  Vector *x_00;
  int i;
  Vector *b_00;
  long lVar10;
  bool bVar11;
  double dVar12;
  double dVar13;
  double local_300;
  int niters;
  double normr0;
  double normr;
  int local_2e0;
  allocator_type local_2d9;
  double local_2d8;
  int local_2cc;
  double local_2c8;
  Vector b;
  vector<double,_std::allocator<double>_> times;
  Vector x;
  int argc_local;
  vector<double,_std::allocator<double>_> opt_times;
  TestNormsData testnorms_data;
  HPCG_Params params;
  vector<double,_std::allocator<double>_> ref_times;
  Vector x_overlap;
  Vector xexact;
  Vector b_computed;
  char **argv_local;
  SparseMatrix A;
  TestCGData testcg_data;
  TestSymmetryData testsymmetry_data;
  CGData data;
  
  argc_local = argc;
  argv_local = argv;
  HPCG_Init(&argc_local,&argv_local,&params);
  iVar7 = params.runningTime;
  iVar1 = CheckAspectRatio(0.125,params.nx,params.ny,params.nz,"local problem",params.comm_rank == 0
                          );
  if (iVar1 == 0) {
    local_2cc = iVar7;
    geom = (Geometry *)operator_new(0x80);
    GenerateGeometry(params.comm_size,params.comm_rank,params.numThreads,params.pz,params.zl,
                     params.zu,params.nx,params.ny,params.nz,params.npx,params.npy,params.npz,geom);
    iVar1 = CheckAspectRatio(0.125,geom->npx,geom->npy,geom->npz,"process grid",
                             params.comm_rank == 0);
    if (iVar1 == 0) {
      local_2e0 = params.comm_rank;
      A.title = (char *)0x0;
      std::vector<double,_std::allocator<double>_>::vector
                (&times,10,(value_type_conflict *)&A,(allocator_type *)&data);
      dVar12 = mytimer();
      A.globalToLocalMap._M_h._M_buckets = &A.globalToLocalMap._M_h._M_single_bucket;
      A.globalToLocalMap._M_h._M_bucket_count = 1;
      A.globalToLocalMap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      A.globalToLocalMap._M_h._M_element_count = 0;
      A.globalToLocalMap._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      A.globalToLocalMap._M_h._M_rehash_policy._M_next_resize = 0;
      A.globalToLocalMap._M_h._M_single_bucket = (__node_base_ptr)0x0;
      A.localToGlobalMap.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      A.localToGlobalMap.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      A.localToGlobalMap.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      A.title = (char *)0x0;
      A.totalNumberOfRows = 0;
      A.totalNumberOfNonzeros._0_4_ = 0;
      A.totalNumberOfNonzeros._4_4_ = 0;
      A.localNumberOfRows = 0;
      A.localNumberOfColumns = 0;
      A.localNumberOfNonzeros = 0;
      A.matrixDiagonal = (double **)0x0;
      A.nonzerosInRow = (char *)0x0;
      A.mtxIndG = (global_int_t **)0x0;
      A.mtxIndL = (local_int_t **)0x0;
      A.matrixValues = (double **)0x0;
      A.isDotProductOptimized = true;
      A.isSpmvOptimized = true;
      A.isMgOptimized = true;
      A.isWaxpbyOptimized = true;
      A.Ac = (SparseMatrix_STRUCT *)0x0;
      A.mgData = (MGData *)0x0;
      b_00 = &b;
      x_00 = &x;
      xexact_00 = &xexact;
      A.geom = geom;
      GenerateProblem(&A,b_00,x_00,xexact_00);
      pSVar9 = &A;
      SetupHalo(pSVar9);
      iVar7 = 3;
      while (bVar11 = iVar7 != 0, iVar7 = iVar7 + -1, bVar11) {
        GenerateCoarseProblem(pSVar9);
        pSVar9 = pSVar9->Ac;
      }
      dVar13 = mytimer();
      times.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[9] = dVar13 - dVar12;
      pSVar9 = &A;
      iVar7 = 4;
      while (bVar11 = iVar7 != 0, iVar7 = iVar7 + -1, bVar11) {
        CheckProblem(pSVar9,b_00,x_00,xexact_00);
        pSVar9 = pSVar9->Ac;
        xexact_00 = (Vector *)0x0;
        x_00 = (Vector *)0x0;
        b_00 = (Vector *)0x0;
      }
      InitializeSparseCGData(&A,&data);
      localLength = A.localNumberOfRows;
      InitializeVector(&x_overlap,A.localNumberOfColumns);
      InitializeVector(&b_computed,localLength);
      bVar11 = local_2cc != 0;
      FillRandomVector(&x_overlap);
      dVar12 = mytimer();
      iVar7 = (uint)bVar11 * 9 + 1;
      local_2d8 = (double)CONCAT44(local_2d8._4_4_,iVar7);
      while (bVar11 = iVar7 != 0, iVar7 = iVar7 + -1, bVar11) {
        iVar1 = ComputeSPMV_ref(&A,&x_overlap,&b_computed);
        if (iVar1 != 0) {
          poVar4 = std::operator<<((ostream *)HPCG_fout,"Error in call to SpMV: ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
          poVar4 = std::operator<<(poVar4,".\n");
          std::endl<char,std::char_traits<char>>(poVar4);
        }
        iVar1 = ComputeMG_ref(&A,&b_computed,&x_overlap);
        if (iVar1 != 0) {
          poVar4 = std::operator<<((ostream *)HPCG_fout,"Error in call to MG: ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
          poVar4 = std::operator<<(poVar4,".\n");
          std::endl<char,std::char_traits<char>>(poVar4);
        }
      }
      dVar13 = mytimer();
      times.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[8] = (dVar13 - dVar12) / (double)local_2d8._0_4_;
      niters = 0;
      normr = 0.0;
      normr0 = 0.0;
      testcg_data.count_pass = 0;
      testcg_data.count_fail = 0;
      std::vector<double,_std::allocator<double>_>::vector
                (&ref_times,9,(value_type_conflict *)&testcg_data,(allocator_type *)&testnorms_data)
      ;
      bVar11 = true;
      iVar1 = 0;
      iVar7 = 0x32;
      while (bVar11) {
        ZeroVector(&x);
        iVar2 = CG_ref(&A,&data,&b,&x,0x32,0.0,&niters,&normr,&normr0,
                       ref_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start,true);
        iVar1 = (iVar1 + 1) - (uint)(iVar2 == 0);
        bVar11 = false;
      }
      if ((local_2e0 == 0) && (iVar1 != 0)) {
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)HPCG_fout,iVar1);
        poVar4 = std::operator<<(poVar4," error(s) in call(s) to reference CG.");
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      local_2c8 = normr / normr0;
      dVar12 = mytimer();
      OptimizeProblem(&A,&data,&b,&x,&xexact);
      dVar13 = mytimer();
      times.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[7] = dVar13 - dVar12;
      testcg_data.count_pass = 0;
      testcg_data.count_fail = 0;
      TestCG(&A,&data,&b,&x,&testcg_data);
      TestSymmetry(&A,&b,&xexact,&testsymmetry_data);
      niters = 0;
      normr = 0.0;
      normr0 = 0.0;
      testnorms_data.values = (double *)0x0;
      std::vector<double,_std::allocator<double>_>::vector
                (&opt_times,9,(value_type_conflict *)&testnorms_data,&local_2d9);
      dVar12 = local_2c8 * 1.000001;
      bVar11 = true;
      local_300 = 0.0;
      iVar2 = 0;
      iVar1 = 0;
      while (iVar3 = local_2e0, bVar11) {
        ZeroVector(&x);
        local_2d8 = *opt_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
        iVar3 = CG(&A,&data,&b,&x,500,local_2c8,&niters,&normr,&normr0,
                   opt_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start,true);
        iVar2 = (iVar2 + 1) - (uint)(iVar3 == 0);
        iVar1 = iVar1 + (uint)(dVar12 < normr / normr0);
        if (iVar7 < niters) {
          iVar7 = niters;
        }
        dVar13 = *opt_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start - local_2d8;
        if (*opt_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start - local_2d8 <= local_300) {
          dVar13 = local_300;
        }
        bVar11 = false;
        local_300 = dVar13;
      }
      if ((local_2e0 == 0) && (iVar2 != 0)) {
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)HPCG_fout,iVar2);
        poVar4 = std::operator<<(poVar4," error(s) in call(s) to optimized CG.");
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      uVar5 = (ulong)(iVar1 != 0);
      if ((iVar3 == 0) && (iVar1 != 0)) {
        poVar4 = std::operator<<((ostream *)HPCG_fout,"Failed to reduce the residual ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
        poVar4 = std::operator<<(poVar4," times.");
        std::endl<char,std::char_traits<char>>(poVar4);
        uVar5 = 1;
      }
      iVar1 = (int)((double)params.runningTime / local_300);
      uVar8 = 0xffffffffffffffff;
      if (-2 < iVar1) {
        uVar8 = (long)iVar1 * 8 + 8;
      }
      local_2d8 = (double)uVar5;
      testnorms_data.samples = iVar1 + 1;
      pdVar6 = (double *)operator_new__(uVar8);
      testnorms_data.values = pdVar6;
      for (lVar10 = 0; lVar10 <= iVar1; lVar10 = lVar10 + 1) {
        ZeroVector(&x);
        iVar2 = CG(&A,&data,&b,&x,iVar7,0.0,&niters,&normr,&normr0,
                   times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start,true);
        if (iVar2 != 0) {
          poVar4 = std::operator<<((ostream *)HPCG_fout,"Error in call to CG: ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
          poVar4 = std::operator<<(poVar4,".\n");
          std::endl<char,std::char_traits<char>>(poVar4);
        }
        if (local_2e0 == 0) {
          poVar4 = std::operator<<((ostream *)HPCG_fout,"Call [");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)lVar10);
          std::operator<<(poVar4,"] Scaled Residual [");
          poVar4 = std::ostream::_M_insert<double>(normr / normr0);
          poVar4 = std::operator<<(poVar4,"]");
          std::endl<char,std::char_traits<char>>(poVar4);
        }
        pdVar6[lVar10] = normr / normr0;
      }
      TestNorms(&testnorms_data);
      ReportResults(&A,4,iVar1 + 1,0x32,iVar7,
                    times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,&testcg_data,&testsymmetry_data,&testnorms_data
                    ,SUB84(local_2d8,0),local_2cc == 0);
      DeleteMatrix(&A);
      DeleteCGData(&data);
      DeleteVector(&x);
      DeleteVector(&b);
      DeleteVector(&xexact);
      DeleteVector(&x_overlap);
      DeleteVector(&b_computed);
      if (testnorms_data.values != (double *)0x0) {
        operator_delete__(testnorms_data.values);
      }
      HPCG_Finalize();
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&opt_times.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&ref_times.super__Vector_base<double,_std::allocator<double>_>);
      SparseMatrix_STRUCT::~SparseMatrix_STRUCT(&A);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&times.super__Vector_base<double,_std::allocator<double>_>);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int main(int argc, char * argv[]) {

#ifndef HPCG_NO_MPI
  MPI_Init(&argc, &argv);
#endif

  HPCG_Params params;

  HPCG_Init(&argc, &argv, params);

  // Check if QuickPath option is enabled.
  // If the running time is set to zero, we minimize all paths through the program
  bool quickPath = (params.runningTime==0);

  int size = params.comm_size, rank = params.comm_rank; // Number of MPI processes, My process ID

#ifdef HPCG_DETAILED_DEBUG
  if (size < 100 && rank==0) HPCG_fout << "Process "<<rank<<" of "<<size<<" is alive with " << params.numThreads << " threads." <<endl;

  if (rank==0) {
    char c;
    std::cout << "Press key to continue"<< std::endl;
    std::cin.get(c);
  }
#ifndef HPCG_NO_MPI
  MPI_Barrier(MPI_COMM_WORLD);
#endif
#endif

  local_int_t nx,ny,nz;
  nx = (local_int_t)params.nx;
  ny = (local_int_t)params.ny;
  nz = (local_int_t)params.nz;
  int ierr = 0;  // Used to check return codes on function calls

  ierr = CheckAspectRatio(0.125, nx, ny, nz, "local problem", rank==0);
  if (ierr)
    return ierr;

  /////////////////////////
  // Problem setup Phase //
  /////////////////////////

#ifdef HPCG_DEBUG
  double t1 = mytimer();
#endif

  // Construct the geometry and linear system
  Geometry * geom = new Geometry;
  GenerateGeometry(size, rank, params.numThreads, params.pz, params.zl, params.zu, nx, ny, nz, params.npx, params.npy, params.npz, geom);

  ierr = CheckAspectRatio(0.125, geom->npx, geom->npy, geom->npz, "process grid", rank==0);
  if (ierr)
    return ierr;

  // Use this array for collecting timing information
  std::vector< double > times(10,0.0);

  double setup_time = mytimer();

  SparseMatrix A;
  InitializeSparseMatrix(A, geom);

  Vector b, x, xexact;
  GenerateProblem(A, &b, &x, &xexact);
  SetupHalo(A);
  int numberOfMgLevels = 4; // Number of levels including first
  SparseMatrix * curLevelMatrix = &A;
  for (int level = 1; level< numberOfMgLevels; ++level) {
    GenerateCoarseProblem(*curLevelMatrix);
    curLevelMatrix = curLevelMatrix->Ac; // Make the just-constructed coarse grid the next level
  }

  setup_time = mytimer() - setup_time; // Capture total time of setup
  times[9] = setup_time; // Save it for reporting

  curLevelMatrix = &A;
  Vector * curb = &b;
  Vector * curx = &x;
  Vector * curxexact = &xexact;
  for (int level = 0; level< numberOfMgLevels; ++level) {
     CheckProblem(*curLevelMatrix, curb, curx, curxexact);
     curLevelMatrix = curLevelMatrix->Ac; // Make the nextcoarse grid the next level
     curb = 0; // No vectors after the top level
     curx = 0;
     curxexact = 0;
  }


  CGData data;
  InitializeSparseCGData(A, data);



  ////////////////////////////////////
  // Reference SpMV+MG Timing Phase //
  ////////////////////////////////////

  // Call Reference SpMV and MG. Compute Optimization time as ratio of times in these routines

  local_int_t nrow = A.localNumberOfRows;
  local_int_t ncol = A.localNumberOfColumns;

  Vector x_overlap, b_computed;
  InitializeVector(x_overlap, ncol); // Overlapped copy of x vector
  InitializeVector(b_computed, nrow); // Computed RHS vector


  // Record execution time of reference SpMV and MG kernels for reporting times
  // First load vector with random values
  FillRandomVector(x_overlap);

  int numberOfCalls = 10;
  if (quickPath) numberOfCalls = 1; //QuickPath means we do on one call of each block of repetitive code
  double t_begin = mytimer();
  for (int i=0; i< numberOfCalls; ++i) {
    ierr = ComputeSPMV_ref(A, x_overlap, b_computed); // b_computed = A*x_overlap
    if (ierr) HPCG_fout << "Error in call to SpMV: " << ierr << ".\n" << endl;
    ierr = ComputeMG_ref(A, b_computed, x_overlap); // b_computed = Minv*y_overlap
    if (ierr) HPCG_fout << "Error in call to MG: " << ierr << ".\n" << endl;
  }
  times[8] = (mytimer() - t_begin)/((double) numberOfCalls);  // Total time divided by number of calls.
#ifdef HPCG_DEBUG
  if (rank==0) HPCG_fout << "Total SpMV+MG timing phase execution time in main (sec) = " << mytimer() - t1 << endl;
#endif

  ///////////////////////////////
  // Reference CG Timing Phase //
  ///////////////////////////////

#ifdef HPCG_DEBUG
  t1 = mytimer();
#endif
  int global_failure = 0; // assume all is well: no failures

  int niters = 0;
  int totalNiters_ref = 0;
  double normr = 0.0;
  double normr0 = 0.0;
  int refMaxIters = 50;
  numberOfCalls = 1; // Only need to run the residual reduction analysis once

  // Compute the residual reduction for the natural ordering and reference kernels
  std::vector< double > ref_times(9,0.0);
  double tolerance = 0.0; // Set tolerance to zero to make all runs do maxIters iterations
  int err_count = 0;
  for (int i=0; i< numberOfCalls; ++i) {
    ZeroVector(x);
    ierr = CG_ref( A, data, b, x, refMaxIters, tolerance, niters, normr, normr0, &ref_times[0], true);
    if (ierr) ++err_count; // count the number of errors in CG
    totalNiters_ref += niters;
  }
  if (rank == 0 && err_count) HPCG_fout << err_count << " error(s) in call(s) to reference CG." << endl;
  double refTolerance = normr / normr0;

  // Call user-tunable set up function.
  double t7 = mytimer();
  OptimizeProblem(A, data, b, x, xexact);
  t7 = mytimer() - t7;
  times[7] = t7;
#ifdef HPCG_DEBUG
  if (rank==0) HPCG_fout << "Total problem setup time in main (sec) = " << mytimer() - t1 << endl;
#endif

#ifdef HPCG_DETAILED_DEBUG
  if (geom->size == 1) WriteProblem(*geom, A, b, x, xexact);
#endif


  //////////////////////////////
  // Validation Testing Phase //
  //////////////////////////////

#ifdef HPCG_DEBUG
  t1 = mytimer();
#endif
  TestCGData testcg_data;
  testcg_data.count_pass = testcg_data.count_fail = 0;
  TestCG(A, data, b, x, testcg_data);

  TestSymmetryData testsymmetry_data;
  TestSymmetry(A, b, xexact, testsymmetry_data);

#ifdef HPCG_DEBUG
  if (rank==0) HPCG_fout << "Total validation (TestCG and TestSymmetry) execution time in main (sec) = " << mytimer() - t1 << endl;
#endif

#ifdef HPCG_DEBUG
  t1 = mytimer();
#endif

  //////////////////////////////
  // Optimized CG Setup Phase //
  //////////////////////////////

  niters = 0;
  normr = 0.0;
  normr0 = 0.0;
  err_count = 0;
  int tolerance_failures = 0;

  int optMaxIters = 10*refMaxIters;
  int optNiters = refMaxIters;
  double opt_worst_time = 0.0;

  std::vector< double > opt_times(9,0.0);

  // Compute the residual reduction and residual count for the user ordering and optimized kernels.
  for (int i=0; i< numberOfCalls; ++i) {
    ZeroVector(x); // start x at all zeros
    double last_cummulative_time = opt_times[0];
    ierr = CG( A, data, b, x, optMaxIters, refTolerance, niters, normr, normr0, &opt_times[0], true);
    if (ierr) ++err_count; // count the number of errors in CG
    // Convergence check accepts an error of no more than 6 significant digits of relTolerance
    if (normr / normr0 > refTolerance * (1.0 + 1.0e-6)) ++tolerance_failures; // the number of failures to reduce residual

    // pick the largest number of iterations to guarantee convergence
    if (niters > optNiters) optNiters = niters;

    double current_time = opt_times[0] - last_cummulative_time;
    if (current_time > opt_worst_time) opt_worst_time = current_time;
  }

#ifndef HPCG_NO_MPI
// Get the absolute worst time across all MPI ranks (time in CG can be different)
  double local_opt_worst_time = opt_worst_time;
  MPI_Allreduce(&local_opt_worst_time, &opt_worst_time, 1, MPI_DOUBLE, MPI_MAX, MPI_COMM_WORLD);
#endif


  if (rank == 0 && err_count) HPCG_fout << err_count << " error(s) in call(s) to optimized CG." << endl;
  if (tolerance_failures) {
    global_failure = 1;
    if (rank == 0)
      HPCG_fout << "Failed to reduce the residual " << tolerance_failures << " times." << endl;
  }

  ///////////////////////////////
  // Optimized CG Timing Phase //
  ///////////////////////////////

  // Here we finally run the benchmark phase
  // The variable total_runtime is the target benchmark execution time in seconds

  double total_runtime = params.runningTime;
  int numberOfCgSets = int(total_runtime / opt_worst_time) + 1; // Run at least once, account for rounding

#ifdef HPCG_DEBUG
  if (rank==0) {
    HPCG_fout << "Projected running time: " << total_runtime << " seconds" << endl;
    HPCG_fout << "Number of CG sets: " << numberOfCgSets << endl;
  }
#endif

  /* This is the timed run for a specified amount of time. */

  optMaxIters = optNiters;
  double optTolerance = 0.0;  // Force optMaxIters iterations
  TestNormsData testnorms_data;
  testnorms_data.samples = numberOfCgSets;
  testnorms_data.values = new double[numberOfCgSets];

  for (int i=0; i< numberOfCgSets; ++i) {
    ZeroVector(x); // Zero out x
    ierr = CG( A, data, b, x, optMaxIters, optTolerance, niters, normr, normr0, &times[0], true);
    if (ierr) HPCG_fout << "Error in call to CG: " << ierr << ".\n" << endl;
    if (rank==0) HPCG_fout << "Call [" << i << "] Scaled Residual [" << normr/normr0 << "]" << endl;
    testnorms_data.values[i] = normr/normr0; // Record scaled residual from this run
  }

  // Compute difference between known exact solution and computed solution
  // All processors are needed here.
#ifdef HPCG_DEBUG
  double residual = 0;
  ierr = ComputeResidual(A.localNumberOfRows, x, xexact, residual);
  if (ierr) HPCG_fout << "Error in call to compute_residual: " << ierr << ".\n" << endl;
  if (rank==0) HPCG_fout << "Difference between computed and exact  = " << residual << ".\n" << endl;
#endif

  // Test Norm Results
  ierr = TestNorms(testnorms_data);

  ////////////////////
  // Report Results //
  ////////////////////

  // Report results to YAML file
  ReportResults(A, numberOfMgLevels, numberOfCgSets, refMaxIters, optMaxIters, &times[0], testcg_data, testsymmetry_data, testnorms_data, global_failure, quickPath);

  // Clean up
  DeleteMatrix(A); // This delete will recursively delete all coarse grid data
  DeleteCGData(data);
  DeleteVector(x);
  DeleteVector(b);
  DeleteVector(xexact);
  DeleteVector(x_overlap);
  DeleteVector(b_computed);
  delete [] testnorms_data.values;



  HPCG_Finalize();

  // Finish up
#ifndef HPCG_NO_MPI
  MPI_Finalize();
#endif
  return 0;
}